

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O3

void __thiscall
iDynTree::SixAxisForceTorqueSensor::~SixAxisForceTorqueSensor(SixAxisForceTorqueSensor *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SixAxisForceTorqueSensorPrivateAttributes *pSVar2;
  pointer pcVar3;
  
  (this->super_JointSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__SixAxisForceTorqueSensor_001858e0;
  pSVar2 = this->pimpl;
  if (pSVar2 != (SixAxisForceTorqueSensorPrivateAttributes *)0x0) {
    pcVar3 = (pSVar2->link2Name)._M_dataplus._M_p;
    paVar1 = &(pSVar2->link2Name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (pSVar2->link1Name)._M_dataplus._M_p;
    paVar1 = &(pSVar2->link1Name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (pSVar2->parent_junction_name)._M_dataplus._M_p;
    paVar1 = &(pSVar2->parent_junction_name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (pSVar2->name)._M_dataplus._M_p;
    paVar1 = &(pSVar2->name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(pSVar2,0x160);
  LinkSensor::~LinkSensor((LinkSensor *)this);
  return;
}

Assistant:

SixAxisForceTorqueSensor::~SixAxisForceTorqueSensor()
{
    delete this->pimpl;
}